

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

errr finish_parse_projection(parser *p)

{
  ushort uVar1;
  angband_constants *paVar2;
  int iVar3;
  void *pvVar4;
  undefined8 *p_00;
  long lVar5;
  int iVar6;
  undefined8 *puVar7;
  char *fmt;
  undefined8 *puVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  
  bVar11 = 0;
  z_info->projection_max = 0;
  pvVar4 = parser_priv(p);
  paVar2 = z_info;
  if (pvVar4 == (void *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar9._0_2_ = z_info->projection_max;
    iVar9._2_2_ = z_info->calculation_max;
    iVar6 = 0;
    do {
      iVar9 = iVar9 + 1;
      paVar2->projection_max = (uint16_t)iVar9;
      if (*(char **)((long)pvVar4 + 0x10) != (char *)0x0) {
        iVar3 = strcmp(*(char **)((long)pvVar4 + 0x10),"element");
        iVar6 = iVar6 + (uint)(iVar3 == 0);
      }
      pvVar4 = *(void **)((long)pvVar4 + 0x68);
    } while (pvVar4 != (void *)0x0);
  }
  if (iVar6 < 0x1c) {
    fmt = "Too few elements in projection.txt!";
  }
  else {
    if (iVar6 == 0x1c) goto LAB_0019c5fe;
    fmt = "Too many elements in projection.txt!";
  }
  quit_fmt(fmt);
LAB_0019c5fe:
  projections = (projection_conflict *)mem_zalloc((ulong)z_info->projection_max * 0x70);
  uVar1 = z_info->projection_max;
  p_00 = (undefined8 *)parser_priv(p);
  if (p_00 != (undefined8 *)0x0) {
    lVar10 = (ulong)uVar1 * 0x70;
    do {
      puVar7 = p_00;
      puVar8 = (undefined8 *)((long)&projections[-1].index + lVar10);
      for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
      }
      puVar7 = (undefined8 *)p_00[0xd];
      mem_free(p_00);
      p_00 = puVar7;
      lVar10 = lVar10 + -0x70;
    } while (puVar7 != (undefined8 *)0x0);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_projection(struct parser *p) {
	struct projection *projection, *next = NULL;
	int element_count = 0, count = 0;

	/* Count the entries */
	z_info->projection_max = 0;
	projection = parser_priv(p);
	while (projection) {
		z_info->projection_max++;
		if (projection->type && streq(projection->type, "element")) {
			element_count++;
		}
		projection = projection->next;
	}

	if (element_count + 1 < (int) N_ELEMENTS(element_names)) {
		quit_fmt("Too few elements in projection.txt!");
	} else if (element_count + 1 > (int) N_ELEMENTS(element_names)) {
		quit_fmt("Too many elements in projection.txt!");
	}

	/* Allocate the direct access list and copy the data to it */
	projections = mem_zalloc((z_info->projection_max) * sizeof(*projection));
	count = z_info->projection_max - 1;
	for (projection = parser_priv(p); projection; projection = next, count--) {
		memcpy(&projections[count], projection, sizeof(*projection));
		next = projection->next;
		mem_free(projection);
	}

	parser_destroy(p);
	return 0;
}